

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O3

int retry_control_set_option(RETRY_CONTROL_HANDLE retry_control_handle,char *name,void *value)

{
  int iVar1;
  OPTIONHANDLER_RESULT OVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  RETRY_CONTROL_INSTANCE *retry_control;
  
  if ((name == (char *)0x0 || retry_control_handle == (RETRY_CONTROL_HANDLE)0x0) ||
      value == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar1 = 0x18e;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x18e;
    }
    pcVar5 = 
    "Failed to set option (either retry_state_handle (%p), name (%p) or value (%p) are NULL)";
    iVar4 = 0x18d;
LAB_00143bc6:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
              ,"retry_control_set_option",iVar4,1,pcVar5);
  }
  else {
    iVar1 = strcmp("initial_wait_time_in_secs",name);
    if (iVar1 == 0) {
      if (*value == 0) {
        p_Var3 = xlogging_get_log_function();
        iVar1 = 0x19b;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x19b;
        }
        pcVar5 = "Failed to set option \'%s\' (value must be equal or greater to 1)";
        iVar4 = 0x19a;
        goto LAB_00143bc6;
      }
      retry_control_handle->initial_wait_time_in_secs = *value;
    }
    else {
      iVar1 = strcmp("max_jitter_percent",name);
      if (iVar1 == 0) {
        if (100 < *value) {
          p_Var3 = xlogging_get_log_function();
          iVar1 = 0x1ab;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return 0x1ab;
          }
          pcVar5 = "Failed to set option \'%s\' (value must be in the range 0 to 100)";
          iVar4 = 0x1aa;
          goto LAB_00143bc6;
        }
        retry_control_handle->max_jitter_percent = *value;
      }
      else {
        iVar1 = strcmp("max_delay_in_secs",name);
        if (iVar1 != 0) {
          iVar1 = strcmp("retry_control_saved_options",name);
          if (iVar1 == 0) {
            OVar2 = OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value,retry_control_handle);
            if (OVar2 == OPTIONHANDLER_OK) goto LAB_00143d43;
            p_Var3 = xlogging_get_log_function();
            iVar1 = 0x1bf;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return 0x1bf;
            }
            pcVar5 = "messenger_set_option failed (OptionHandler_FeedOptions failed)";
            iVar4 = 0x1be;
          }
          else {
            p_Var3 = xlogging_get_log_function();
            iVar1 = 0x1c9;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return 0x1c9;
            }
            pcVar5 = "messenger_set_option failed (option with name \'%s\' is not suppported)";
            iVar4 = 0x1c8;
          }
          goto LAB_00143bc6;
        }
        retry_control_handle->max_delay_in_secs = *value;
      }
    }
LAB_00143d43:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int retry_control_set_option(RETRY_CONTROL_HANDLE retry_control_handle, const char* name, const void* value)
{
    int result;

    if (retry_control_handle == NULL || name == NULL || value == NULL)
    {
        LogError("Failed to set option (either retry_state_handle (%p), name (%p) or value (%p) are NULL)", retry_control_handle, name, value);
        result = MU_FAILURE;
    }
    else
    {
        RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

        if (strcmp(RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, name) == 0)
        {
            unsigned int cast_value = *((unsigned int*)value);

            if (cast_value < 1)
            {
                LogError("Failed to set option '%s' (value must be equal or greater to 1)", name);
                result = MU_FAILURE;
            }
            else
            {
                retry_control->initial_wait_time_in_secs = cast_value;

                result = RESULT_OK;
            }
        }
        else if (strcmp(RETRY_CONTROL_OPTION_MAX_JITTER_PERCENT, name) == 0)
        {
            unsigned int cast_value = *((unsigned int*)value);

            if (cast_value > 100) // it's unsigned int, it doesn't need to be checked for less than zero.
            {
                LogError("Failed to set option '%s' (value must be in the range 0 to 100)", name);
                result = MU_FAILURE;
            }
            else
            {
                retry_control->max_jitter_percent = cast_value;

                result = RESULT_OK;
            }
        }
        else if (strcmp(RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS, name) == 0)
        {
            retry_control->max_delay_in_secs = *((unsigned int*)value);

            result = RESULT_OK;
        }
        else if (strcmp(RETRY_CONTROL_OPTION_SAVED_OPTIONS, name) == 0)
        {
            if (OptionHandler_FeedOptions((OPTIONHANDLER_HANDLE)value, retry_control_handle) != OPTIONHANDLER_OK)
            {
                LogError("messenger_set_option failed (OptionHandler_FeedOptions failed)");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        else
        {
            LogError("messenger_set_option failed (option with name '%s' is not suppported)", name);
            result = MU_FAILURE;
        }
    }

    return result;
}